

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commodore.cpp
# Opt level: O1

void __thiscall Storage::Tape::Commodore::Parser::Parser(Parser *this)

{
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).super_Parser<Storage::Tape::Commodore::SymbolType>._vptr_Parser = (_func_int **)0x0;
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).super_Parser<Storage::Tape::Commodore::SymbolType>.error_flag_ = false;
  *(undefined3 *)
   &(this->
    super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
    ).super_Parser<Storage::Tape::Commodore::SymbolType>.field_0x9 = 0;
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).super_Parser<Storage::Tape::Commodore::SymbolType>.next_symbol_ = One;
  *(undefined8 *)
   &(this->
    super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
    ).super_Parser<Storage::Tape::Commodore::SymbolType>.has_next_symbol_ = 0;
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).wave_queue_.
  super__Vector_base<Storage::Tape::Commodore::WaveType,_std::allocator<Storage::Tape::Commodore::WaveType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).wave_queue_.
  super__Vector_base<Storage::Tape::Commodore::WaveType,_std::allocator<Storage::Tape::Commodore::WaveType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).wave_queue_.
  super__Vector_base<Storage::Tape::Commodore::WaveType,_std::allocator<Storage::Tape::Commodore::WaveType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).super_Parser<Storage::Tape::Commodore::SymbolType>.error_flag_ = false;
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).super_Parser<Storage::Tape::Commodore::SymbolType>.has_next_symbol_ = false;
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).wave_queue_.
  super__Vector_base<Storage::Tape::Commodore::WaveType,_std::allocator<Storage::Tape::Commodore::WaveType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).wave_queue_.
  super__Vector_base<Storage::Tape::Commodore::WaveType,_std::allocator<Storage::Tape::Commodore::WaveType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).wave_queue_.
  super__Vector_base<Storage::Tape::Commodore::WaveType,_std::allocator<Storage::Tape::Commodore::WaveType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).super_Parser<Storage::Tape::Commodore::SymbolType>._vptr_Parser =
       (_func_int **)&PTR_process_pulse_005ab840;
  this->parity_byte_ = '\0';
  this->previous_was_high_ = false;
  this->wave_period_ = 0.0;
  return;
}

Assistant:

Parser::Parser() :
	Storage::Tape::PulseClassificationParser<WaveType, SymbolType>() {}